

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChMatterMeshless::FillBox
          (ChMatterMeshless *this,ChVector<double> *size,double spacing,double initial_density,
          ChCoordsys<double> *boxcoords,bool do_centeredcube,double kernel_sfactor,double randomness
          )

{
  pointer psVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar3 [16];
  double coll_radius;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ChMatterMeshless *pCVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 in_register_00001208 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined8 in_XMM3_Qb;
  undefined1 auVar26 [16];
  ChVector<double> v;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  double local_1c8;
  double local_188;
  undefined1 local_168 [16];
  double local_158;
  double local_148;
  ChMatterMeshless *local_140;
  ChVector<double> local_138;
  double local_118;
  undefined8 uStack_110;
  double local_100;
  undefined1 local_f8 [16];
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  auVar20._8_56_ = in_register_00001208;
  auVar20._0_8_ = spacing;
  local_1c8 = size->m_data[0];
  auVar19 = auVar20._0_16_;
  local_188 = SUB168(*(undefined1 (*) [16])(size->m_data + 1),0);
  local_148 = initial_density;
  local_140 = this;
  local_100 = kernel_sfactor;
  if ((int)(local_1c8 / spacing) < 1) {
    local_1d8 = SUB84(size->m_data[2],0);
    uStack_1d4 = (undefined4)((ulong)size->m_data[2] >> 0x20);
    dVar16 = 0.0;
  }
  else {
    auVar26._8_8_ = spacing;
    auVar26._0_8_ = spacing;
    local_d8 = randomness * 0.5;
    iVar15 = 0;
    auVar3 = vdivpd_avx(*(undefined1 (*) [16])(size->m_data + 1),auVar26);
    local_88._0_8_ =
         (ulong)do_centeredcube * (long)local_d8 + (ulong)!do_centeredcube * (long)randomness;
    local_88._8_8_ = in_XMM3_Qb;
    uStack_b0 = 0;
    auVar23._0_4_ = (int)auVar3._0_8_;
    auVar23._4_4_ = (int)auVar3._8_8_;
    auVar23._8_8_ = 0;
    uVar14 = vpcmpgtd_avx512vl(auVar23,ZEXT816(0) << 0x40);
    local_e8 = spacing * 0.5;
    local_a8._8_8_ = 0xbfe0000000000000;
    local_a8._0_8_ = 0xbfe0000000000000;
    iVar9 = 0;
    uStack_c0 = 0;
    local_118 = 0.0;
    dStack_e0 = local_e8;
    dStack_d0 = local_d8;
    local_c8 = local_e8;
    local_b8 = local_d8;
    local_98 = (double)local_88._0_8_;
    dStack_90 = (double)local_88._0_8_;
    do {
      uStack_110 = 0;
      if ((uVar14 & 1) != 0) {
        auVar25 = ZEXT864(0) << 0x40;
        iVar10 = 0;
        do {
          local_f8 = auVar25._0_16_;
          if (((uVar14 & 0xf) >> 1 & 1) != 0) {
            auVar3._8_8_ = uStack_110;
            auVar3._0_8_ = local_118;
            auVar25 = ZEXT864(0) << 0x40;
            local_78 = vunpcklpd_avx(auVar3,local_f8);
            iVar12 = auVar23._4_4_;
            do {
              auVar21._0_8_ = (double)local_a8._0_8_ * size->m_data[0];
              auVar21._8_8_ = (double)local_a8._8_8_ * size->m_data[1];
              local_168 = vfmadd231pd_fma(auVar21,auVar26,local_78);
              auVar24._8_8_ = 0;
              auVar24._0_8_ = size->m_data[2] * -0.5;
              auVar3 = vfmadd231sd_fma(auVar24,auVar25._0_16_,auVar20._0_16_);
              local_158 = auVar3._0_8_;
              dVar16 = ChRandom();
              dVar17 = ChRandom();
              dVar18 = ChRandom();
              auVar4._8_8_ = extraout_XMM0_Qb;
              auVar4._0_8_ = dVar16;
              auVar6._8_8_ = extraout_XMM0_Qb_00;
              auVar6._0_8_ = dVar17;
              auVar3 = vunpcklpd_avx(auVar4,auVar6);
              local_168._8_8_ = auVar3._8_8_ * dStack_90 * spacing + (double)local_168._8_8_;
              local_168._0_8_ = auVar3._0_8_ * local_98 * spacing + (double)local_168._0_8_;
              local_158 = dVar18 * (double)local_88._0_8_ * spacing + local_158;
              ChCoordsys<double>::TransformLocalToParent(boxcoords,(ChVector<double> *)local_168);
              AddNode(this,&local_48);
              if (do_centeredcube) {
                local_138.m_data[0] = local_e8 + (double)local_168._0_8_;
                local_138.m_data[1] = dStack_e0 + (double)local_168._8_8_;
                local_138.m_data[2] = local_c8 + local_158;
                dVar16 = ChRandom();
                dVar17 = ChRandom();
                dVar18 = ChRandom();
                auVar5._8_8_ = extraout_XMM0_Qb_01;
                auVar5._0_8_ = dVar16;
                auVar7._8_8_ = extraout_XMM0_Qb_02;
                auVar7._0_8_ = dVar17;
                auVar3 = vunpcklpd_avx(auVar5,auVar7);
                local_138.m_data[0] = auVar3._0_8_ * local_d8 * spacing + local_138.m_data[0];
                local_138.m_data[1] = auVar3._8_8_ * dStack_d0 * spacing + local_138.m_data[1];
                local_138.m_data[2] = dVar18 * local_b8 * spacing + local_138.m_data[2];
                ChCoordsys<double>::TransformLocalToParent(boxcoords,&local_138);
                AddNode(this,&local_60);
                iVar15 = iVar15 + 2;
              }
              else {
                iVar15 = iVar15 + 1;
              }
              auVar20 = ZEXT1664(auVar19);
              iVar12 = iVar12 + -1;
              auVar25 = ZEXT864((ulong)(auVar25._0_8_ + 1.0));
            } while (iVar12 != 0);
          }
          auVar25 = ZEXT864((ulong)((double)local_f8._0_8_ + 1.0));
          iVar10 = iVar10 + 1;
        } while (iVar10 != auVar23._0_4_);
      }
      local_118 = local_118 + 1.0;
      iVar9 = iVar9 + 1;
      uStack_110 = 0;
    } while (iVar9 != (int)(local_1c8 / spacing));
    local_1c8 = size->m_data[0];
    local_188 = size->m_data[1];
    local_1d8 = SUB84(size->m_data[2],0);
    uStack_1d4 = (undefined4)((ulong)size->m_data[2] >> 0x20);
    dVar16 = (double)iVar15;
  }
  pCVar8 = local_140;
  iVar9 = (*(local_140->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])
                    (local_140);
  if (iVar9 != 0) {
    lVar13 = 8;
    uVar14 = 0;
    dVar17 = local_188 * local_1c8 * (double)CONCAT44(uStack_1d4,local_1d8) * local_148;
    dVar18 = spacing * local_100;
    coll_radius = spacing * 0.1;
    do {
      psVar1 = (pCVar8->nodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar2 = *(long **)((long)psVar1 + lVar13 + -8);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar1->
                         super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + lVar13);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (plVar2 == (long *)0x0) {
        __assert_fail("mnode",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.cpp"
                      ,0xfb,
                      "void chrono::fea::ChMatterMeshless::FillBox(const ChVector<>, const double, const double, const ChCoordsys<>, const bool, const double, const double)"
                     );
      }
      plVar2[0x55] = (long)dVar18;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar18 * 0.5 - (double)plVar2[0x56];
      auVar19 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar19);
      collision::ChCollisionModelBullet::SetSphereRadius
                ((ChCollisionModelBullet *)plVar2[0x4f],(double)plVar2[0x56],auVar19._0_8_);
      plVar2[0x56] = (long)coll_radius;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = (double)plVar2[0x55] * 0.5 - coll_radius;
      auVar19 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar22);
      collision::ChCollisionModelBullet::SetSphereRadius
                ((ChCollisionModelBullet *)plVar2[0x4f],coll_radius,auVar19._0_8_);
      (**(code **)(*plVar2 + 0x98))(dVar17 / dVar16,plVar2);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      uVar14 = uVar14 + 1;
      uVar11 = (*(pCVar8->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])
                         (pCVar8);
      lVar13 = lVar13 + 0x10;
    } while (uVar14 < uVar11);
  }
  (((pCVar8->material).
    super___shared_ptr<chrono::fea::ChContinuumElastoplastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  super_ChContinuumElastic).super_ChContinuumMaterial.density = local_148;
  return;
}

Assistant:

void ChMatterMeshless::FillBox(const ChVector<> size,
                               const double spacing,
                               const double initial_density,
                               const ChCoordsys<> boxcoords,
                               const bool do_centeredcube,
                               const double kernel_sfactor,
                               const double randomness) {
    int samples_x = (int)(size.x() / spacing);
    int samples_y = (int)(size.y() / spacing);
    int samples_z = (int)(size.z() / spacing);
    int totsamples = 0;

    double mrandomness = randomness;
    if (do_centeredcube)
        mrandomness = randomness * 0.5;

    for (int ix = 0; ix < samples_x; ix++)
        for (int iy = 0; iy < samples_y; iy++)
            for (int iz = 0; iz < samples_z; iz++) {
                ChVector<> pos(ix * spacing - 0.5 * size.x(), iy * spacing - 0.5 * size.y(), iz * spacing - 0.5 * size.z());
                pos += ChVector<>(mrandomness * ChRandom() * spacing, mrandomness * ChRandom() * spacing,
                                  mrandomness * ChRandom() * spacing);
                AddNode(boxcoords.TransformLocalToParent(pos));
                totsamples++;

                if (do_centeredcube) {
                    ChVector<> pos2 = pos + 0.5 * ChVector<>(spacing, spacing, spacing);
                    pos2 += ChVector<>(mrandomness * ChRandom() * spacing, mrandomness * ChRandom() * spacing,
                                       mrandomness * ChRandom() * spacing);
                    AddNode(boxcoords.TransformLocalToParent(pos2));
                    totsamples++;
                }
            }

    double mtotvol = size.x() * size.y() * size.z();
    double mtotmass = mtotvol * initial_density;
    double nodemass = mtotmass / (double)totsamples;
    double kernelrad = kernel_sfactor * spacing;

    for (unsigned int ip = 0; ip < GetNnodes(); ip++) {
        // downcasting
        std::shared_ptr<ChNodeMeshless> mnode(nodes[ip]);
        assert(mnode);

        mnode->SetKernelRadius(kernelrad);
        mnode->SetCollisionRadius(spacing * 0.1);
        mnode->SetMass(nodemass);
    }

    GetMaterial()->Set_density(initial_density);
}